

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *cs;
  ulong uVar1;
  allocator<char> local_107;
  allocator<char> local_106;
  allocator<char> local_105;
  TestShaderType local_104;
  undefined8 local_100;
  string shader_source;
  string expression_type_declarations;
  string expressions [4];
  
  local_104 = tested_shader_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expression_type_declarations,
             "uniform int a;\nconst int b = 0;\nint c = 0;\nfloat x[2][2];\n",
             (allocator<char> *)expressions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expressions,"a",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>((string *)(expressions + 1),"b",&local_105);
  std::__cxx11::string::string<std::allocator<char>>((string *)(expressions + 2),"c",&local_106);
  std::__cxx11::string::string<std::allocator<char>>((string *)(expressions + 3),"0 + 1",&local_107)
  ;
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  uVar1 = (ulong)local_104;
  local_100 = 0;
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_104) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xd1b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b7ffee::switchdataD_017222e0 +
         (long)(int)(&switchD_00b7ffee::switchdataD_017222e0)[uVar1]) {
  case 0xb7fff0:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb80001:
  case 0xb80008:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_017222f8 + *(int *)(&DAT_017222f8 + uVar1 * 4)))();
  return;
}

Assistant:

void ExpressionsDynamicIndexing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string expression_type_declarations = "uniform int a;\n"
											   "const int b = 0;\n"
											   "int c = 0;\n"
											   "float x[2][2];\n";

	std::string expressions[] = { "a", "b", "c", "0 + 1" };
	std::string shader_source;

	for (size_t write_index = 0; write_index < sizeof(expressions) / sizeof(expressions[0]); write_index++)
	{
		for (size_t read_index = 0; read_index < sizeof(expressions) / sizeof(expressions[0]); read_index++)
		{
			shader_source = expression_type_declarations;
			shader_source += shader_start;
			shader_source += "    x[";
			shader_source += expressions[write_index];
			shader_source += "][";
			shader_source += expressions[read_index];
			shader_source += "] = 1.0;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* for (int read_index = 0; ...) */
	}	 /* for (int write_index = 0; ...) */
}